

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connect-unspecified.c
# Opt level: O3

int run_test_connect_unspecified(void)

{
  sa_family_t sVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *loop;
  anon_union_28_2_e90107a3_for_address *paVar3;
  ulong uVar4;
  uv_interface_address_t *addresses;
  uv_handle_t *handle;
  bool bVar5;
  int64_t eval_b_4;
  int64_t eval_b_5;
  sockaddr_in6 addr6;
  sockaddr_in addr4;
  uv_connect_t connect6;
  uv_connect_t connect4;
  uv_tcp_t socket6;
  uv_tcp_t socket4;
  undefined1 auStack_2f8 [48];
  uv_handle_t *local_2c8;
  sockaddr_in6 local_2c0;
  sockaddr_in local_2a0;
  uv_connect_t local_290;
  uv_connect_t local_228;
  uv_tcp_t local_1c0;
  uv_tcp_t local_e8;
  
  auStack_2f8._24_8_ = (uv_close_cb)0x1805de;
  loop = uv_default_loop();
  auStack_2f8._24_8_ = (uv_close_cb)0x1805f1;
  iVar2 = uv_tcp_init(loop,&local_e8);
  local_1c0.data = (void *)(long)iVar2;
  local_228.data = (void *)0x0;
  if ((uv_interface_address_t *)local_1c0.data == (uv_interface_address_t *)0x0) {
    auStack_2f8._24_8_ = (uv_close_cb)0x180633;
    iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,&local_2a0);
    local_1c0.data = (void *)(long)iVar2;
    local_228.data = (void *)0x0;
    if ((uv_interface_address_t *)local_1c0.data != (uv_interface_address_t *)0x0)
    goto LAB_00180853;
    auStack_2f8._24_8_ = (uv_close_cb)0x180680;
    iVar2 = uv_tcp_connect(&local_228,&local_e8,(sockaddr *)&local_2a0,connect_4);
    local_1c0.data = (void *)(long)iVar2;
    local_290.data = (void *)0x0;
    if ((uv_interface_address_t *)local_1c0.data != (uv_interface_address_t *)0x0)
    goto LAB_00180868;
    auStack_2f8._24_8_ = (uv_close_cb)0x1806b8;
    iVar2 = uv_interface_addresses((uv_interface_address_t **)&local_1c0,(int *)&local_290);
    if (iVar2 != 0) {
LAB_001806bc:
      auStack_2f8._24_8_ = (uv_close_cb)0x1806c6;
      iVar2 = uv_run(loop,UV_RUN_DEFAULT);
      auStack_2f8._40_8_ = SEXT48(iVar2);
      local_2c8 = (uv_handle_t *)0x0;
      if ((uv_handle_t *)auStack_2f8._40_8_ != (uv_handle_t *)0x0) goto LAB_0018087a;
      auStack_2f8._24_8_ = (uv_close_cb)0x1806f7;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      auStack_2f8._24_8_ = (uv_close_cb)0x180701;
      uv_run(loop,UV_RUN_DEFAULT);
      auStack_2f8._40_8_ = (uv_handle_t *)0x0;
      auStack_2f8._24_8_ = (uv_close_cb)0x180712;
      iVar2 = uv_loop_close(loop);
      local_2c8 = (uv_handle_t *)(long)iVar2;
      if ((uv_handle_t *)auStack_2f8._40_8_ == local_2c8) {
        auStack_2f8._24_8_ = (uv_close_cb)0x18072e;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00180889;
    }
    addresses = (uv_interface_address_t *)local_1c0.data;
    iVar2 = (int)local_290.data;
    if ((long)(int)local_290.data < 1) {
LAB_00180834:
      auStack_2f8._24_8_ = (uv_close_cb)0x180839;
      uv_free_interface_addresses(addresses,iVar2);
      goto LAB_001806bc;
    }
    paVar3 = (anon_union_28_2_e90107a3_for_address *)((long)local_1c0.data + 0x14);
    uVar4 = 1;
    do {
      sVar1 = (paVar3->address4).sin_family;
      if (sVar1 == 10) break;
      paVar3 = (anon_union_28_2_e90107a3_for_address *)((long)paVar3 + 0x60);
      bVar5 = uVar4 < (ulong)(long)(int)local_290.data;
      uVar4 = uVar4 + 1;
    } while (bVar5);
    auStack_2f8._24_8_ = (uv_close_cb)0x180777;
    uv_free_interface_addresses((uv_interface_address_t *)local_1c0.data,(int)local_290.data);
    if (sVar1 != 10) goto LAB_001806bc;
    auStack_2f8._24_8_ = (uv_close_cb)0x180791;
    iVar2 = uv_tcp_init(loop,&local_1c0);
    local_290.data = (void *)(long)iVar2;
    local_2c0.sin6_family = 0;
    local_2c0.sin6_port = 0;
    local_2c0.sin6_flowinfo = 0;
    if (local_290.data == (void *)0x0) {
      auStack_2f8._24_8_ = (uv_close_cb)0x1807c7;
      iVar2 = uv_ip6_addr("::",0x23a3,&local_2c0);
      local_290.data = (void *)(long)iVar2;
      auStack_2f8._40_8_ = (uv_handle_t *)0x0;
      if (local_290.data != (void *)0x0) goto LAB_001808a7;
      auStack_2f8._24_8_ = (uv_close_cb)0x180805;
      iVar2 = uv_tcp_connect(&local_290,&local_1c0,(sockaddr *)&local_2c0,connect_6);
      auStack_2f8._40_8_ = SEXT48(iVar2);
      local_2c8 = (uv_handle_t *)0x0;
      if ((uv_handle_t *)auStack_2f8._40_8_ != (uv_handle_t *)0x0) {
        addresses = (uv_interface_address_t *)(auStack_2f8 + 0x28);
        iVar2 = (int)&local_2c8;
        auStack_2f8._24_8_ = (uv_close_cb)0x180834;
        run_test_connect_unspecified_cold_6();
        goto LAB_00180834;
      }
      goto LAB_001806bc;
    }
  }
  else {
    auStack_2f8._24_8_ = (uv_close_cb)0x180853;
    run_test_connect_unspecified_cold_1();
LAB_00180853:
    auStack_2f8._24_8_ = (uv_close_cb)0x180868;
    run_test_connect_unspecified_cold_2();
LAB_00180868:
    auStack_2f8._24_8_ = (uv_close_cb)0x18087a;
    run_test_connect_unspecified_cold_3();
LAB_0018087a:
    auStack_2f8._24_8_ = (uv_close_cb)0x180889;
    run_test_connect_unspecified_cold_7();
LAB_00180889:
    auStack_2f8._24_8_ = (uv_close_cb)0x180898;
    run_test_connect_unspecified_cold_8();
  }
  auStack_2f8._24_8_ = (uv_close_cb)0x1808a7;
  run_test_connect_unspecified_cold_4();
LAB_001808a7:
  iVar2 = (int)auStack_2f8 + 0x28;
  auStack_2f8._24_8_ = connect_4;
  run_test_connect_unspecified_cold_5();
  auStack_2f8._24_8_ = SEXT48(iVar2);
  auStack_2f8._16_8_ = 0xffffffffffffff9d;
  if ((uv_close_cb)auStack_2f8._24_8_ != (uv_close_cb)0xffffffffffffff9d) {
    return iVar2;
  }
  iVar2 = (int)auStack_2f8 + 0x10;
  auStack_2f8._0_8_ = connect_6;
  connect_4_cold_1();
  auStack_2f8._0_8_ = SEXT48(iVar2);
  if ((void *)auStack_2f8._0_8_ != (void *)0xffffffffffffff9d) {
    return iVar2;
  }
  handle = (uv_handle_t *)auStack_2f8;
  connect_6_cold_1();
  iVar2 = uv_is_closing(handle);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(connect_unspecified) {
  uv_loop_t* loop;
  uv_tcp_t socket4;
  struct sockaddr_in addr4;
  uv_connect_t connect4;
  uv_tcp_t socket6;
  struct sockaddr_in6 addr6;
  uv_connect_t connect6;

  loop = uv_default_loop();

  ASSERT_OK(uv_tcp_init(loop, &socket4));
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr4));
  ASSERT_OK(uv_tcp_connect(&connect4,
                           &socket4,
                           (const struct sockaddr*) &addr4,
                           connect_4));

  if (can_ipv6()) {
    ASSERT_OK(uv_tcp_init(loop, &socket6));
    ASSERT_OK(uv_ip6_addr("::", TEST_PORT, &addr6));
    ASSERT_OK(uv_tcp_connect(&connect6,
                             &socket6,
                             (const struct sockaddr*) &addr6,
                             connect_6));
  }

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}